

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O1

void genxDispose(genxWriter w)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  void **ppvVar4;
  void *pvVar5;
  utf8 __ptr;
  long lVar6;
  
  ppvVar1 = (w->elements).pointers;
  ppvVar2 = (w->attributes).pointers;
  ppvVar3 = (w->prefixes).pointers;
  if (0 < (w->namespaces).count) {
    ppvVar4 = (w->namespaces).pointers;
    lVar6 = 0;
    do {
      pvVar5 = *(void **)((long)ppvVar4[lVar6] + 8);
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar5);
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar5);
      }
      pvVar5 = ppvVar4[lVar6];
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar5);
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (w->namespaces).count);
  }
  if (0 < (w->elements).count) {
    lVar6 = 0;
    do {
      pvVar5 = *(void **)((long)ppvVar1[lVar6] + 8);
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar5);
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar5);
      }
      pvVar5 = ppvVar1[lVar6];
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar5);
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (w->elements).count);
  }
  if (0 < (w->attributes).count) {
    lVar6 = 0;
    do {
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(*(void **)((long)ppvVar2[lVar6] + 8));
        }
      }
      else {
        (*w->dealloc)(w->userData,*(void **)((long)ppvVar2[lVar6] + 8));
      }
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(*(void **)((long)ppvVar2[lVar6] + 0x18));
        }
      }
      else {
        (*w->dealloc)(w->userData,*(void **)((long)ppvVar2[lVar6] + 0x18));
      }
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(ppvVar2[lVar6]);
        }
      }
      else {
        (*w->dealloc)(w->userData,ppvVar2[lVar6]);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (w->attributes).count);
  }
  if (0 < (w->prefixes).count) {
    lVar6 = 0;
    do {
      pvVar5 = ppvVar3[lVar6];
      if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
        if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
          free(pvVar5);
        }
      }
      else {
        (*w->dealloc)(w->userData,pvVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (w->prefixes).count);
  }
  ppvVar1 = (w->namespaces).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->elements).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->attributes).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->prefixes).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  ppvVar1 = (w->stack).pointers;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(ppvVar1);
    }
  }
  else {
    (*w->dealloc)(w->userData,ppvVar1);
  }
  __ptr = (w->arec).value.buf;
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(__ptr);
    }
  }
  else {
    (*w->dealloc)(w->userData,__ptr);
  }
  if (w->dealloc == (_func_void_void_ptr_void_ptr *)0x0) {
    if (w->alloc == (_func_void_ptr_void_ptr_int *)0x0) {
      free(w->empty);
    }
  }
  else {
    (*w->dealloc)(w->userData,w->empty);
  }
  if (w->dealloc != (_func_void_void_ptr_void_ptr *)0x0) {
    (*w->dealloc)(w->userData,w);
    return;
  }
  if (w->alloc != (_func_void_ptr_void_ptr_int *)0x0) {
    return;
  }
  free(w);
  return;
}

Assistant:

void genxDispose(genxWriter w)
{
  int i;
  genxNamespace * nn = (genxNamespace *) w->namespaces.pointers;
  genxElement * ee = (genxElement *) w->elements.pointers;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  utf8 * pp = (utf8 *) w->prefixes.pointers;

  for (i = 0; i < w->namespaces.count; i++)
  {
    deallocate(w, nn[i]->name);
    deallocate(w, nn[i]);
  }

  for (i = 0; i < w->elements.count; i++)
  {
    deallocate(w, ee[i]->type);
    deallocate(w, ee[i]);
  }

  for (i = 0; i < w->attributes.count; i++)
  {
    deallocate(w, aa[i]->name);
    deallocate(w, aa[i]->value.buf);
    deallocate(w, aa[i]);
  }

  for(i = 0; i < w->prefixes.count; i++)
    deallocate(w, pp[i]);

  deallocate(w, w->namespaces.pointers);
  deallocate(w, w->elements.pointers);
  deallocate(w, w->attributes.pointers);
  deallocate(w, w->prefixes.pointers);
  deallocate(w, w->stack.pointers);

  deallocate(w, w->arec.value.buf);

  deallocate(w, w->empty);

  /* how Oscar dealt with Igli */
  deallocate(w, w);
}